

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
* __thiscall
google::protobuf::Map<int,std::__cxx11::string>::TryEmplaceInternal<int,std::__cxx11::string>
          (pair<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,int *k,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  BaseIt it;
  BaseIt it_00;
  undefined8 args_00;
  bool bVar1;
  ViewType VVar2;
  NodeBase *node_00;
  NodeAndBucket NVar3;
  bool local_c9;
  NodeBase *local_c8;
  void *local_c0;
  map_index_t local_b8;
  undefined4 uStack_b4;
  iterator local_b0;
  NodeBase *local_98;
  Node *node;
  NodeBase *local_88;
  void *local_80;
  map_index_t local_78;
  undefined4 uStack_74;
  iterator local_70;
  map_index_t local_54;
  NodeBase *pNStack_50;
  map_index_t b;
  NodeAndBucket p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  int *k_local;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  Node *node_1;
  
  p._8_8_ = args;
  VVar2 = internal::TransparentSupport<int>::ToView(*k);
  NVar3 = internal::KeyMapBase<unsigned_int>::FindHelper((KeyMapBase<unsigned_int> *)this,VVar2);
  local_88 = NVar3.node;
  local_78 = NVar3.bucket;
  local_54 = local_78;
  pNStack_50 = local_88;
  p.node._0_4_ = local_78;
  if (local_88 == (NodeBase *)0x0) {
    bVar1 = internal::KeyMapBase<unsigned_int>::ResizeIfLoadIsOutOfRange
                      ((KeyMapBase<unsigned_int> *)this,(ulong)(*this + 1));
    if (bVar1) {
      VVar2 = internal::TransparentSupport<int>::ToView(*k);
      local_54 = internal::KeyMapBase<unsigned_int>::BucketNumber
                           ((KeyMapBase<unsigned_int> *)this,VVar2);
    }
    args_00 = p._8_8_;
    node_00 = internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x30);
    bVar1 = internal::InitializeMapKey<int,int>
                      ((int *)(node_00 + 1),k,*(Arena **)((long)this + 0x18));
    if (!bVar1) {
      Arena::CreateInArenaStorage<int,int>((int *)(node_00 + 1),*(Arena **)((long)this + 0x18),k);
    }
    Arena::CreateInArenaStorage<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(node_00 + 2),
               *(Arena **)((long)this + 0x18),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_00);
    local_98 = node_00;
    internal::KeyMapBase<unsigned_int>::InsertUnique
              ((KeyMapBase<unsigned_int> *)this,local_54,(KeyNode *)node_00);
    *(int *)this = *this + 1;
    local_c8 = local_98;
    local_b8 = local_54;
    it_00._20_4_ = uStack_b4;
    it_00.bucket_index_ = local_54;
    it_00.m_ = (UntypedMapBase *)this;
    it_00.node_ = local_98;
    local_c0 = this;
    Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    iterator::iterator(&local_b0,it_00);
    local_c9 = true;
    std::make_pair<google::protobuf::Map<int,std::__cxx11::string>::iterator,bool>
              (__return_storage_ptr__,&local_b0,&local_c9);
  }
  else {
    it._20_4_ = uStack_74;
    it.bucket_index_ = local_78;
    it.m_ = (UntypedMapBase *)this;
    it.node_ = local_88;
    local_80 = this;
    Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    iterator::iterator(&local_70,it);
    node._7_1_ = 0;
    std::make_pair<google::protobuf::Map<int,std::__cxx11::string>::iterator,bool>
              (__return_storage_ptr__,&local_70,(bool *)((long)&node + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> TryEmplaceInternal(K&& k, Args&&... args) {
    auto p = this->FindHelper(TS::ToView(k));
    internal::map_index_t b = p.bucket;
    // Case 1: key was already present.
    if (p.node != nullptr) {
      return std::make_pair(iterator(internal::UntypedMapIterator{
                                static_cast<Node*>(p.node), this, p.bucket}),
                            false);
    }
    // Case 2: insert.
    if (this->ResizeIfLoadIsOutOfRange(this->num_elements_ + 1)) {
      b = this->BucketNumber(TS::ToView(k));
    }
    auto* node = CreateNode(std::forward<K>(k), std::forward<Args>(args)...);
    this->InsertUnique(b, node);
    ++this->num_elements_;
    return std::make_pair(iterator(internal::UntypedMapIterator{node, this, b}),
                          true);
  }